

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::MultiTransformNode::MultiTransformNode
          (MultiTransformNode *this,avector<avector<AffineSpace3ff>_> *spaces_in,
          Ref<embree::SceneGraph::Node> *child)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  long *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  size_t j;
  avector<AffineSpace3ff> s;
  size_t i;
  size_t array_size;
  size_t time_steps;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> v;
  size_t i_5;
  size_t i_7;
  size_t i_6;
  size_t i_4;
  size_t i_3;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *old_items;
  size_t i_2;
  size_t i_1;
  size_t new_size_alloced;
  undefined7 in_stack_fffffffffffffa28;
  undefined1 in_stack_fffffffffffffa2f;
  Node *in_stack_fffffffffffffa30;
  undefined1 *in_stack_fffffffffffffa38;
  undefined1 *puVar6;
  undefined4 local_518;
  undefined4 local_514;
  undefined1 auStack_510 [8];
  ulong local_508;
  ulong local_500;
  void *local_4f8;
  undefined1 local_4f0;
  ulong local_4e8;
  undefined1 local_4e0 [8];
  ulong local_4d8;
  ulong local_4d0;
  void *local_4c8;
  ulong local_4c0;
  ulong local_4b8;
  ulong local_4b0;
  long *local_498;
  long local_490;
  undefined1 *local_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  long *local_418;
  long *local_410;
  undefined4 local_400;
  undefined4 local_3fc;
  undefined1 *local_3f8;
  undefined4 *local_3f0;
  undefined4 *local_3e8;
  undefined4 *local_3e0;
  undefined4 *local_3d8;
  ulong local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  ulong local_3b8;
  undefined1 *local_3b0;
  undefined8 *local_3a8;
  undefined8 *local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  undefined8 *local_368;
  undefined8 *local_360;
  undefined8 *local_358;
  undefined8 *local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 *local_320;
  undefined8 *local_318;
  undefined8 *local_310;
  undefined8 *local_308;
  undefined8 *local_300;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 *local_2d8;
  undefined8 *local_2d0;
  undefined8 *local_2c8;
  undefined8 *local_2c0;
  undefined8 *local_2b8;
  undefined8 *local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  undefined8 *local_258;
  undefined8 *local_250;
  undefined8 *local_248;
  undefined8 *local_240;
  undefined8 *local_238;
  undefined8 *local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  undefined8 *local_218;
  long local_210;
  ulong local_208;
  long local_200;
  undefined8 local_1f8;
  long local_1f0;
  long local_1e8;
  ulong local_1e0;
  long local_1d8;
  ulong local_1c0;
  undefined1 *local_1b8;
  ulong local_1b0;
  void *local_1a8;
  undefined1 *local_1a0;
  ulong local_180;
  ulong local_178;
  void *local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  undefined1 *local_148;
  void *local_140;
  void *local_138;
  ulong local_130;
  undefined1 *local_128;
  undefined8 *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  void *local_f8;
  void *local_f0;
  long local_e8;
  long local_e0;
  void *local_d8;
  long local_d0;
  long local_c8;
  void *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  long local_98;
  long local_90;
  undefined8 *local_88;
  undefined8 *local_80;
  undefined8 *local_78;
  undefined8 *local_70;
  undefined8 *local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  ulong local_48;
  void *local_40;
  undefined1 *local_38;
  unsigned_long local_30 [2];
  ulong local_20;
  ulong local_18;
  undefined1 *local_10;
  ulong local_8;
  
  local_498 = in_RDX;
  local_490 = in_RSI;
  Node::Node(in_stack_fffffffffffffa30,(bool)in_stack_fffffffffffffa2f);
  *in_RDI = &PTR__MultiTransformNode_005ff0b8;
  std::
  vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
  ::vector((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
            *)0x3c818d);
  local_410 = in_RDI + 0x10;
  local_418 = local_498;
  *local_410 = *local_498;
  if (*local_410 != 0) {
    (**(code **)(*(long *)*local_410 + 0x10))();
  }
  local_210 = local_490;
  local_4b0 = *(ulong *)(local_490 + 8);
  local_1f0 = local_490;
  local_1f8 = 0;
  local_1e8 = *(long *)(local_490 + 0x18);
  local_4b8 = *(ulong *)(local_1e8 + 8);
  for (local_4c0 = 0; local_4c0 < local_4b8; local_4c0 = local_4c0 + 1) {
    local_480 = local_4e0;
    local_4d8 = 0;
    local_4d0 = 0;
    local_4c8 = (void *)0x0;
    for (local_4e8 = 0; uVar1 = local_4d8, local_4e8 < local_4b0; local_4e8 = local_4e8 + 1) {
      local_200 = local_490;
      local_208 = local_4e8;
      local_1d8 = *(long *)(local_490 + 0x18) + local_4e8 * 0x20;
      local_1e0 = local_4c0;
      local_438 = (undefined8 *)(*(long *)(local_1d8 + 0x18) + local_4c0 * 0x40);
      local_360 = &local_478;
      local_2f8 = &local_468;
      local_300 = &local_458;
      local_2e8 = &local_448;
      local_478 = *local_438;
      uStack_470 = local_438[1];
      local_2b0 = local_438 + 2;
      local_2a8 = &local_468;
      local_468 = *local_2b0;
      uStack_460 = local_438[3];
      local_2c0 = local_438 + 4;
      local_2b8 = &local_458;
      local_458 = *local_2c0;
      uStack_450 = local_438[5];
      local_358 = local_438 + 6;
      local_350 = &local_448;
      local_448 = *local_358;
      uStack_440 = local_438[7];
      local_18 = local_4d8 + 1;
      local_430 = local_4e0;
      local_368 = local_438;
      local_348 = local_360;
      local_2f0 = local_360;
      local_2d0 = local_438;
      local_2c8 = local_360;
      local_2a0 = local_438;
      local_298 = local_360;
      local_10 = local_4e0;
      if (local_4d0 < local_18) {
        uVar3 = local_18;
        if (local_4d0 != 0) {
          local_20 = local_4d0;
          while (local_20 < local_18) {
            local_30[1] = 1;
            local_30[0] = local_20 << 1;
            puVar5 = std::max<unsigned_long>(local_30 + 1,local_30);
            local_20 = *puVar5;
          }
          local_8 = local_20;
          uVar3 = local_8;
        }
      }
      else {
        uVar3 = local_4d0;
      }
      local_8 = uVar3;
      local_158 = local_8;
      uVar3 = uVar1;
      uVar4 = local_4d8;
      if (uVar1 < local_4d8) {
        while (local_160 = uVar3, uVar4 = uVar1, local_160 < local_4d8) {
          uVar3 = local_160 + 1;
        }
      }
      local_4d8 = uVar4;
      local_148 = local_4e0;
      if (local_8 == local_4d0) {
        for (local_168 = local_4d8; local_4d8 = uVar1, local_168 < uVar1; local_168 = local_168 + 1)
        {
          local_140 = (void *)((long)local_4c8 + local_168 * 0x40);
          local_e0 = (long)local_140 + 0x10;
          local_e8 = (long)local_140 + 0x20;
          local_90 = (long)local_140 + 0x30;
          local_f0 = local_140;
          local_d8 = local_140;
        }
      }
      else {
        local_170 = local_4c8;
        local_130 = local_8;
        local_150 = uVar1;
        local_128 = local_4e0;
        local_4c8 = alignedMalloc((size_t)in_stack_fffffffffffffa38,
                                  (size_t)in_stack_fffffffffffffa30);
        for (local_178 = 0; local_178 < local_4d8; local_178 = local_178 + 1) {
          local_118 = (undefined8 *)((long)local_4c8 + local_178 * 0x40);
          local_120 = (undefined8 *)((long)local_170 + local_178 * 0x40);
          local_b0 = local_118 + 2;
          local_b8 = local_118 + 4;
          local_a0 = local_118 + 6;
          uVar2 = local_120[1];
          *local_118 = *local_120;
          local_118[1] = uVar2;
          local_68 = local_120 + 2;
          local_60 = local_118 + 2;
          uVar2 = local_120[3];
          *local_60 = *local_68;
          local_118[3] = uVar2;
          local_78 = local_120 + 4;
          local_70 = local_118 + 4;
          uVar2 = local_120[5];
          *local_70 = *local_78;
          local_118[5] = uVar2;
          local_110 = local_120 + 6;
          local_108 = local_118 + 6;
          uVar2 = local_120[7];
          *local_108 = *local_110;
          local_118[7] = uVar2;
          local_100 = local_118;
          local_a8 = local_118;
          local_88 = local_120;
          local_80 = local_118;
          local_58 = local_120;
          local_50 = local_118;
        }
        for (local_180 = local_4d8; local_180 < local_150; local_180 = local_180 + 1) {
          local_138 = (void *)((long)local_4c8 + local_180 * 0x40);
          local_c8 = (long)local_138 + 0x10;
          local_d0 = (long)local_138 + 0x20;
          local_98 = (long)local_138 + 0x30;
          local_f8 = local_138;
          local_c0 = local_138;
        }
        local_48 = local_4d0;
        local_40 = local_170;
        local_38 = local_4e0;
        alignedFree((void *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28));
        local_4d8 = local_150;
        local_4d0 = local_158;
      }
      local_380 = (undefined8 *)((long)local_4c8 + local_4d8 * 0x40);
      local_388 = &local_478;
      local_310 = local_380 + 2;
      local_318 = local_380 + 4;
      local_2e0 = local_380 + 6;
      *local_380 = local_478;
      local_380[1] = uStack_470;
      local_270 = &local_468;
      local_268 = local_380 + 2;
      *local_268 = local_468;
      local_380[3] = uStack_460;
      local_280 = &local_458;
      local_278 = local_380 + 4;
      *local_278 = local_458;
      local_380[5] = uStack_450;
      local_378 = &local_448;
      local_370 = local_380 + 6;
      *local_370 = local_448;
      local_380[7] = uStack_440;
      local_340 = local_380;
      local_308 = local_380;
      local_290 = local_388;
      local_288 = local_380;
      local_260 = local_388;
      local_258 = local_380;
      local_150 = local_4d8;
      local_4d8 = local_4d8 + 1;
    }
    local_3f0 = &local_518;
    local_3f8 = local_4e0;
    local_3fc = 0;
    local_400 = 0x3f800000;
    local_3e0 = &local_3fc;
    local_3e8 = &local_400;
    local_518 = 0;
    local_514 = 0x3f800000;
    local_3c0 = auStack_510;
    local_508 = local_4d8;
    local_3b8 = local_4d0;
    local_3d8 = local_3f0;
    local_3c8 = local_3f8;
    local_3b0 = local_3c0;
    local_500 = local_3b8;
    local_4f8 = alignedMalloc((size_t)in_stack_fffffffffffffa38,(size_t)in_stack_fffffffffffffa30);
    for (local_3d0 = 0; local_3d0 < local_508; local_3d0 = local_3d0 + 1) {
      local_3a0 = (undefined8 *)((long)local_4f8 + local_3d0 * 0x40);
      local_3a8 = (undefined8 *)(*(long *)(local_3c8 + 0x18) + local_3d0 * 0x40);
      local_328 = local_3a0 + 2;
      local_330 = local_3a0 + 4;
      local_2d8 = local_3a0 + 6;
      uVar2 = local_3a8[1];
      *local_3a0 = *local_3a8;
      local_3a0[1] = uVar2;
      local_230 = local_3a8 + 2;
      local_228 = local_3a0 + 2;
      uVar2 = local_3a8[3];
      *local_228 = *local_230;
      local_3a0[3] = uVar2;
      local_240 = local_3a8 + 4;
      local_238 = local_3a0 + 4;
      uVar2 = local_3a8[5];
      *local_238 = *local_240;
      local_3a0[5] = uVar2;
      local_398 = local_3a8 + 6;
      local_390 = local_3a0 + 6;
      uVar2 = local_3a8[7];
      *local_390 = *local_398;
      local_3a0[7] = uVar2;
      local_338 = local_3a0;
      local_320 = local_3a0;
      local_250 = local_3a8;
      local_248 = local_3a0;
      local_220 = local_3a8;
      local_218 = local_3a0;
    }
    local_4f0 = 0;
    std::
    vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
    ::push_back((vector<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                 *)in_stack_fffffffffffffa30,
                (value_type *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28));
    Transformations::~Transformations((Transformations *)in_stack_fffffffffffffa30);
    puVar6 = local_4e0;
    for (local_1c0 = 0; local_1c0 < local_4d8; local_1c0 = local_1c0 + 1) {
    }
    local_1b0 = local_4d0;
    local_1a8 = local_4c8;
    local_428 = puVar6;
    local_1b8 = puVar6;
    local_1a0 = puVar6;
    alignedFree((void *)CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28));
    in_stack_fffffffffffffa38 = puVar6;
    *(undefined8 *)(puVar6 + 0x18) = 0;
    *(undefined8 *)(puVar6 + 0x10) = 0;
    *(undefined8 *)(puVar6 + 8) = 0;
  }
  return;
}

Assistant:

MultiTransformNode (const avector<avector<AffineSpace3ff>>& spaces_in, const Ref<Node>& child)
        : child(child)
      {
        assert(spaces_in.size() > 0);
        const size_t time_steps = spaces_in.size();
        const size_t array_size = spaces_in[0].size();
        for (size_t i = 0; i < array_size; ++i) {
          avector<AffineSpace3ff> s;
          for (size_t j = 0; j < time_steps; ++j) {
            s.push_back(spaces_in[j][i]);
          }
          spaces.push_back(Transformations(s));
        }
      }